

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

int process_read_last_line(process_info_t *p,char *buffer,size_t buffer_len)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *pcStack_30;
  int r;
  char *ptr;
  size_t buffer_len_local;
  char *buffer_local;
  process_info_t *p_local;
  
  iVar1 = fseek((FILE *)p->stdout_file,0,0);
  if (iVar1 < 0) {
    perror("fseek");
    p_local._4_4_ = -1;
  }
  else {
    *buffer = '\0';
    while (pcVar2 = fgets(buffer,(int)buffer_len,(FILE *)p->stdout_file), pcStack_30 = buffer,
          pcVar2 != (char *)0x0) {
      while( true ) {
        bVar3 = false;
        if ((*pcStack_30 != '\0') && (bVar3 = false, *pcStack_30 != '\r')) {
          bVar3 = *pcStack_30 != '\n';
        }
        if (!bVar3) break;
        pcStack_30 = pcStack_30 + 1;
      }
      *pcStack_30 = '\0';
    }
    iVar1 = ferror((FILE *)p->stdout_file);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      perror("read");
      *buffer = '\0';
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int process_read_last_line(process_info_t *p,
                           char* buffer,
                           size_t buffer_len) {
  char* ptr;

  int r = fseek(p->stdout_file, 0, SEEK_SET);
  if (r < 0) {
    perror("fseek");
    return -1;
  }

  buffer[0] = '\0';

  while (fgets(buffer, buffer_len, p->stdout_file) != NULL) {
    for (ptr = buffer; *ptr && *ptr != '\r' && *ptr != '\n'; ptr++)
      ;
    *ptr = '\0';
  }

  if (ferror(p->stdout_file)) {
    perror("read");
    buffer[0] = '\0';
    return -1;
  }
  return 0;
}